

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int copy_from_lzss_window(archive_read *a,void *buffer,int64_t startpos,int length)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  void *__src;
  
  pvVar1 = a->format->data;
  uVar4 = (uint)startpos & *(uint *)((long)pvVar1 + 0x358);
  uVar2 = (*(uint *)((long)pvVar1 + 0x358) - uVar4) + 1;
  if ((int)uVar2 < 0) {
    archive_set_error(&a->archive,0x54,"Bad RAR file data");
    iVar3 = -0x1e;
  }
  else {
    __src = (void *)((long)(int)uVar4 + *(long *)((long)pvVar1 + 0x350));
    if (length - uVar2 == 0 || length < (int)uVar2) {
      __n = (size_t)length;
    }
    else {
      memcpy(buffer,__src,(ulong)uVar2);
      __src = *(void **)((long)pvVar1 + 0x350);
      __n = (size_t)(int)(length - uVar2);
    }
    memcpy(buffer,__src,__n);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
copy_from_lzss_window(struct archive_read *a, void *buffer,
                      int64_t startpos, int length)
{
  int windowoffs, firstpart;
  struct rar *rar = (struct rar *)(a->format->data);

  windowoffs = lzss_offset_for_position(&rar->lzss, startpos);
  firstpart = lzss_size(&rar->lzss) - windowoffs;
  if (firstpart < 0) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Bad RAR file data");
    return (ARCHIVE_FATAL);
  }
  if (firstpart < length) {
    memcpy(buffer, &rar->lzss.window[windowoffs], firstpart);
    memcpy(buffer, &rar->lzss.window[0], length - firstpart);
  } else {
    memcpy(buffer, &rar->lzss.window[windowoffs], length);
  }
  return (ARCHIVE_OK);
}